

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialect_detection.cpp
# Opt level: O3

void __thiscall duckdb::CSVSniffer::DetectDialect(CSVSniffer *this)

{
  CSVReaderOptions *options;
  pointer puVar1;
  CSVErrorHandler *this_00;
  pointer puVar2;
  idx_t best_ignored_rows;
  idx_t prev_padding_count;
  idx_t best_consistent_rows;
  idx_t rows_read;
  vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_true>
  csv_state_machines;
  CSVError error;
  DialectCandidates dialect_candidates;
  _Head_base<0UL,_duckdb::ColumnCountScanner_*,_false> local_270;
  idx_t local_268 [4];
  vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
  local_248;
  string local_228;
  undefined1 local_208 [32];
  _Alloc_hider local_1e8;
  char local_1d8 [24];
  idx_t iStack_1c0;
  _Alloc_hider local_1b8;
  char local_1a8 [16];
  idx_t local_198;
  idx_t iStack_190;
  idx_t local_188;
  optional_idx oStack_180;
  undefined1 local_178 [32];
  _Alloc_hider local_158;
  char local_148 [24];
  idx_t iStack_130;
  _Alloc_hider local_128;
  char local_118 [16];
  idx_t local_108;
  idx_t iStack_100;
  idx_t local_f8;
  optional_idx oStack_f0;
  DialectCandidates local_e8;
  
  DialectCandidates::DialectCandidates(&local_e8,(CSVStateMachineOptions *)this->options);
  local_268[3] = 0;
  local_268[2] = 0;
  local_268[1] = 0;
  local_268[0] = 0;
  local_248.
  super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_248.
  super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_248.
  super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  GenerateStateMachineSearchSpace
            (this,(vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_true>
                   *)&local_248,&local_e8);
  puVar1 = local_248.
           super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_248.
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_248.
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    puVar2 = local_248.
             super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_270._M_head_impl =
           (puVar2->
           super_unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>_>
           )._M_t.
           super___uniq_ptr_impl<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ColumnCountScanner_*,_std::default_delete<duckdb::ColumnCountScanner>_>
           .super__Head_base<0UL,_duckdb::ColumnCountScanner_*,_false>._M_head_impl;
      (puVar2->
      super_unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>_>
      )._M_t.
      super___uniq_ptr_impl<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ColumnCountScanner_*,_std::default_delete<duckdb::ColumnCountScanner>_>
      .super__Head_base<0UL,_duckdb::ColumnCountScanner_*,_false>._M_head_impl =
           (ColumnCountScanner *)0x0;
      AnalyzeDialectCandidate
                (this,(unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>
                       *)&local_270,local_268 + 3,local_268 + 2,local_268 + 1,local_268);
      if (local_270._M_head_impl != (ColumnCountScanner *)0x0) {
        (*((local_270._M_head_impl)->super_BaseScanner)._vptr_BaseScanner[1])();
      }
      local_270._M_head_impl = (ColumnCountScanner *)0x0;
      puVar2 = puVar2 + 1;
    } while (puVar2 != puVar1);
  }
  RefineCandidates(this);
  if ((this->candidates).
      super_vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->candidates).
      super_vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    CSVError::CSVError((CSVError *)local_208);
    if (this->all_fail_max_line_size == true) {
      ::std::__cxx11::string::_M_assign((string *)local_208);
      ::std::__cxx11::string::_M_assign((string *)&local_1e8);
      local_1d8[0x10] = (this->line_error).type;
      local_1d8._17_7_ = *(undefined7 *)&(this->line_error).field_0x41;
      iStack_1c0 = (this->line_error).column_idx;
      ::std::__cxx11::string::_M_assign((string *)&local_1b8);
      local_198 = (this->line_error).error_info.boundary_idx;
      iStack_190 = (this->line_error).error_info.lines_in_batch;
      local_188 = (this->line_error).row_byte_position;
      oStack_180.index = (this->line_error).byte_position.index;
    }
    else {
      options = this->options;
      DialectCandidates::Print_abi_cxx11_(&local_228,&local_e8);
      CSVError::SniffingError
                ((CSVError *)local_178,options,&local_228,this->max_columns_found_error,
                 &this->set_columns);
      ::std::__cxx11::string::operator=((string *)local_208,(string *)local_178);
      ::std::__cxx11::string::operator=((string *)&local_1e8,(string *)&local_158);
      local_1d8[0x10] = local_148[0x10];
      local_1d8[0x11] = local_148[0x11];
      local_1d8[0x12] = local_148[0x12];
      local_1d8[0x13] = local_148[0x13];
      local_1d8[0x14] = local_148[0x14];
      local_1d8[0x15] = local_148[0x15];
      local_1d8[0x16] = local_148[0x16];
      local_1d8[0x17] = local_148[0x17];
      iStack_1c0 = iStack_130;
      ::std::__cxx11::string::operator=((string *)&local_1b8,(string *)&local_128);
      local_198 = local_108;
      iStack_190 = iStack_100;
      local_188 = local_f8;
      oStack_180.index = oStack_f0.index;
      if (local_128._M_p != local_118) {
        operator_delete(local_128._M_p);
      }
      if (local_158._M_p != local_148) {
        operator_delete(local_158._M_p);
      }
      if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
        operator_delete((void *)local_178._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p);
      }
    }
    this_00 = shared_ptr<duckdb::CSVErrorHandler,_true>::operator->(&this->error_handler);
    CSVErrorHandler::Error(this_00,(CSVError *)local_208,true);
    if (local_1b8._M_p != local_1a8) {
      operator_delete(local_1b8._M_p);
    }
    if (local_1e8._M_p != local_1d8) {
      operator_delete(local_1e8._M_p);
    }
    if ((undefined1 *)local_208._0_8_ != local_208 + 0x10) {
      operator_delete((void *)local_208._0_8_);
    }
  }
  ::std::
  vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
  ::~vector(&local_248);
  ::std::
  _Hashtable<unsigned_char,_std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>,_std::allocator<std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_e8.escape_candidates_map._M_h);
  ::std::
  _Hashtable<unsigned_char,_std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>,_std::allocator<std::pair<const_unsigned_char,_duckdb::vector<char,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_e8.quote_candidates_map._M_h);
  if (local_e8.quote_rule_candidates.
      super_vector<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>.
      super__Vector_base<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.quote_rule_candidates.
                    super_vector<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>.
                    super__Vector_base<duckdb::QuoteRule,_std::allocator<duckdb::QuoteRule>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_e8.comment_candidates.super_vector<char,_std::allocator<char>_>.
      super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(local_e8.comment_candidates.super_vector<char,_std::allocator<char>_>.
                    super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                    _M_start);
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_e8);
  return;
}

Assistant:

void CSVSniffer::DetectDialect() {
	// Variables for Dialect Detection
	DialectCandidates dialect_candidates(options.dialect_options.state_machine_options);
	// Number of rows read
	idx_t rows_read = 0;
	// Best Number of consistent rows (i.e., presenting all columns)
	idx_t best_consistent_rows = 0;
	// If padding was necessary (i.e., rows are missing some columns, how many)
	idx_t prev_padding_count = 0;
	// Min number of ignores rows
	idx_t best_ignored_rows = 0;
	// Vector of CSV State Machines
	vector<unique_ptr<ColumnCountScanner>> csv_state_machines;
	// Step 1: Generate state machines
	GenerateStateMachineSearchSpace(csv_state_machines, dialect_candidates);
	// Step 2: Analyze all candidates on the first chunk
	for (auto &state_machine : csv_state_machines) {
		AnalyzeDialectCandidate(std::move(state_machine), rows_read, best_consistent_rows, prev_padding_count,
		                        best_ignored_rows);
	}
	// Step 3: Loop over candidates and find if they can still produce good results for the remaining chunks
	RefineCandidates();

	// if no dialect candidate was found, we throw an exception
	if (candidates.empty()) {
		CSVError error;
		if (all_fail_max_line_size) {
			error = line_error;
		} else {
			error = CSVError::SniffingError(options, dialect_candidates.Print(), max_columns_found_error, set_columns);
		}
		error_handler->Error(error, true);
	}
}